

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

double dtl_sv_to_dbl(dtl_sv_t *self,_Bool *ok)

{
  int64_t iVar1;
  dtl_sv_type_id dVar2;
  undefined1 auVar3 [16];
  double local_28;
  double retval;
  _Bool success;
  _Bool *ok_local;
  dtl_sv_t *self_local;
  
  retval._7_1_ = false;
  local_28 = 0.0;
  if (self != (dtl_sv_t *)0x0) {
    dVar2 = dtl_sv_type(self);
    switch(dVar2) {
    case DTL_SV_NONE:
      break;
    case DTL_SV_I32:
      local_28 = (double)(self->pAny->val).i32;
      retval._7_1_ = true;
      break;
    case DTL_SV_U32:
      local_28 = (double)(self->pAny->val).u32;
      retval._7_1_ = true;
      break;
    case DTL_SV_I64:
      local_28 = (double)(self->pAny->val).i64;
      retval._7_1_ = true;
      break;
    case DTL_SV_U64:
      iVar1 = (self->pAny->val).i64;
      auVar3._8_4_ = (int)((ulong)iVar1 >> 0x20);
      auVar3._0_8_ = iVar1;
      auVar3._12_4_ = 0x45300000;
      local_28 = (auVar3._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0);
      retval._7_1_ = true;
      break;
    case DTL_SV_FLT:
      local_28 = (double)(self->pAny->val).flt;
      retval._7_1_ = true;
      break;
    case DTL_SV_DBL:
      local_28 = (self->pAny->val).dbl;
      retval._7_1_ = true;
      break;
    case DTL_SV_CHAR:
      local_28 = (double)(int)(self->pAny->val).cr;
      retval._7_1_ = true;
      break;
    case DTL_SV_BOOL:
      local_28 = (double)((self->pAny->val).cr & 1);
      retval._7_1_ = true;
      break;
    case DTL_SV_STR:
      break;
    case DTL_SV_PTR:
      break;
    case DTL_SV_DV:
      break;
    case DTL_SV_BYTES:
      break;
    case DTL_SV_BYTEARRAY:
    }
  }
  if (ok != (_Bool *)0x0) {
    *ok = retval._7_1_;
  }
  return local_28;
}

Assistant:

double dtl_sv_to_dbl(const dtl_sv_t *self, bool *ok)
{
   bool success = false;
   double retval = 0u;

   if(self != 0)
   {
      switch(dtl_sv_type(self))
      {
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
         retval = (double) self->pAny->val.i32;
         success = true;
         break;
      case DTL_SV_U32:
         retval = (double) self->pAny->val.u32;
         success = true;
         break;
      case DTL_SV_FLT:
         retval = (double) self->pAny->val.flt;
         success = true;
         break;
      case DTL_SV_I64:
         retval = (double) self->pAny->val.i64;
         success = true;
         break;
      case DTL_SV_U64:
         retval = (double) self->pAny->val.u64;
         success = true;
         break;
      case DTL_SV_DBL:
         retval = self->pAny->val.dbl;
         success = true;
         break;
      case DTL_SV_BOOL:
         retval = (double) self->pAny->val.bl;
         success = true;
         break;
      case DTL_SV_CHAR:
         retval = (double)self->pAny->val.cr;
         success = true;
         break;
      case DTL_SV_STR:
         break;
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   if (ok != 0)
   {
      *ok = success;
   }
   return retval;
}